

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffx.c
# Opt level: O1

int ptls_ffx_setup_crypto
              (ptls_cipher_context_t *_ctx,ptls_cipher_algorithm_t *algo,int is_enc,int nb_rounds,
              size_t bit_length,void *key)

{
  int iVar1;
  st_ptls_cipher_algorithm_t *psVar2;
  _func_void_st_ptls_cipher_context_t_ptr_void_ptr_void_ptr_size_t *p_Var3;
  _func_void_st_ptls_cipher_context_t_ptr_void_ptr *p_Var4;
  
  if (0xf7 < bit_length - 9) {
    __assert_fail("len <= 32 && len >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/ffx.c",
                  0x29,
                  "int ptls_ffx_setup_crypto(ptls_cipher_context_t *, ptls_cipher_algorithm_t *, int, int, size_t, const void *)"
                 );
  }
  if (_ctx->do_dispose != (_func_void_st_ptls_cipher_context_t_ptr *)0x0) {
    __assert_fail("ctx->super.do_dispose == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/ffx.c",
                  0x2a,
                  "int ptls_ffx_setup_crypto(ptls_cipher_context_t *, ptls_cipher_algorithm_t *, int, int, size_t, const void *)"
                 );
  }
  if (_ctx->do_init != (_func_void_st_ptls_cipher_context_t_ptr_void_ptr *)0x0) {
    __assert_fail("ctx->super.do_init == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/ffx.c",
                  0x2b,
                  "int ptls_ffx_setup_crypto(ptls_cipher_context_t *, ptls_cipher_algorithm_t *, int, int, size_t, const void *)"
                 );
  }
  if (_ctx->do_transform == (_func_void_st_ptls_cipher_context_t_ptr_void_ptr_void_ptr_size_t *)0x0)
  {
    p_Var4 = (_func_void_st_ptls_cipher_context_t_ptr_void_ptr *)(bit_length + 7 >> 3);
    psVar2 = _ctx->algo;
    if (psVar2 != (st_ptls_cipher_algorithm_t *)0x0) {
      if (algo->key_size != psVar2->key_size) {
        __assert_fail("ctx->super.algo == NULL || algo->key_size == ctx->super.algo->key_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/ffx.c"
                      ,0x2d,
                      "int ptls_ffx_setup_crypto(ptls_cipher_context_t *, ptls_cipher_algorithm_t *, int, int, size_t, const void *)"
                     );
      }
      if (psVar2 != (st_ptls_cipher_algorithm_t *)0x0) {
        if (algo->iv_size != psVar2->iv_size) {
          __assert_fail("ctx->super.algo == NULL || algo->iv_size == ctx->super.algo->iv_size",
                        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/ffx.c"
                        ,0x2e,
                        "int ptls_ffx_setup_crypto(ptls_cipher_context_t *, ptls_cipher_algorithm_t *, int, int, size_t, const void *)"
                       );
        }
        if ((psVar2 != (st_ptls_cipher_algorithm_t *)0x0) &&
           ((_func_void_st_ptls_cipher_context_t_ptr_void_ptr *)psVar2->block_size != p_Var4)) {
          __assert_fail("ctx->super.algo == NULL || ctx->super.algo->block_size == len",
                        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/ffx.c"
                        ,0x2f,
                        "int ptls_ffx_setup_crypto(ptls_cipher_context_t *, ptls_cipher_algorithm_t *, int, int, size_t, const void *)"
                       );
        }
      }
    }
    if (algo->iv_size == 0x10) {
      psVar2 = (st_ptls_cipher_algorithm_t *)ptls_cipher_new(algo,1,key);
      if (psVar2 == (st_ptls_cipher_algorithm_t *)0x0) {
        ffx_dispose(_ctx);
        iVar1 = 0x203;
      }
      else {
        _ctx[1].algo = psVar2;
        *(int *)&_ctx[1].do_dispose = nb_rounds;
        *(int *)((long)&_ctx[1].do_dispose + 4) = is_enc;
        _ctx[1].do_init = p_Var4;
        p_Var3 = (_func_void_st_ptls_cipher_context_t_ptr_void_ptr_void_ptr_size_t *)
                 (bit_length + 7 >> 4);
        _ctx[1].do_transform = p_Var3;
        _ctx[2].algo = (st_ptls_cipher_algorithm_t *)(p_Var4 + -(long)p_Var3);
        *(undefined *)&_ctx[2].do_dispose = (&DAT_0012ce1c)[(uint)bit_length & 7];
        (*ptls_clear_memory)((void *)((long)&_ctx[2].do_dispose + 1),0x10);
        _ctx->do_dispose = ffx_dispose;
        _ctx->do_init = ffx_init;
        _ctx->do_transform = ffx_encrypt;
        iVar1 = 0;
      }
      return iVar1;
    }
    __assert_fail("algo->iv_size == 16",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/ffx.c",
                  0x30,
                  "int ptls_ffx_setup_crypto(ptls_cipher_context_t *, ptls_cipher_algorithm_t *, int, int, size_t, const void *)"
                 );
  }
  __assert_fail("ctx->super.do_transform == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/ffx.c",0x2c
                ,
                "int ptls_ffx_setup_crypto(ptls_cipher_context_t *, ptls_cipher_algorithm_t *, int, int, size_t, const void *)"
               );
}

Assistant:

int ptls_ffx_setup_crypto(ptls_cipher_context_t *_ctx, ptls_cipher_algorithm_t *algo, int is_enc, int nb_rounds, size_t bit_length,
                          const void *key)
{
    int ret = 0;
    ptls_ffx_context_t *ctx = (ptls_ffx_context_t *)_ctx;
    ptls_cipher_context_t *enc_ctx = NULL;
    size_t len = (bit_length + 7) / 8;
    uint8_t last_byte_mask[8] = {0xFF, 0xFE, 0xFC, 0xF8, 0xF0, 0xE0, 0xC0, 0x80};

    assert(len <= 32 && len >= 2);
    assert(ctx->super.do_dispose == NULL);
    assert(ctx->super.do_init == NULL);
    assert(ctx->super.do_transform == NULL);
    assert(ctx->super.algo == NULL || algo->key_size == ctx->super.algo->key_size);
    assert(ctx->super.algo == NULL || algo->iv_size == ctx->super.algo->iv_size);
    assert(ctx->super.algo == NULL || ctx->super.algo->block_size == len);
    assert(algo->iv_size == 16);

    if (len <= 32 && len >= 2) {
        /* len must be lower than 32 */
        enc_ctx = ptls_cipher_new(algo, 1, key);

        if (enc_ctx == NULL) {
            ret = PTLS_ERROR_LIBRARY;
        }
    } else {
        ret = PTLS_ERROR_LIBRARY;
    }

    if (ret == 0) {
        ctx->enc_ctx = enc_ctx;
        ctx->nb_rounds = nb_rounds;
        ctx->is_enc = is_enc;
        ctx->byte_length = len;
        ctx->nb_left = (int)len / 2;
        ctx->nb_right = (int)len - ctx->nb_left;
        ctx->mask_last_byte = last_byte_mask[bit_length % 8];
        ptls_clear_memory(ctx->tweaks, sizeof(ctx->tweaks));

        ctx->super.do_dispose = ffx_dispose;
        ctx->super.do_init = ffx_init;
        ctx->super.do_transform = ffx_encrypt;
    } else {
        ffx_dispose(_ctx);
    }

    return ret;
}